

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot.h
# Opt level: O3

storage_range_t
calculateMedianRange<Result<unsigned_int,double>>
          (vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_> *rs,
          function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
          *valuesFunc,storage_t sizePercent)

{
  pointer pRVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> *__x;
  ulong uVar3;
  ulong uVar4;
  pointer pRVar5;
  double dVar6;
  double dVar7;
  storage_range_t sVar8;
  vector<double,_std::allocator<double>_> v;
  double local_60;
  vector<double,_std::allocator<double>_> local_58;
  storage_t local_40;
  double local_38;
  double local_30;
  double local_28;
  
  pRVar5 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 == pRVar1) {
    dVar6 = 1.79769313486232e+308;
    dVar7 = -1.79769313486232e+308;
  }
  else {
    dVar7 = -1.79769313486232e+308;
    local_60 = 1.79769313486232e+308;
    local_40 = sizePercent;
    do {
      local_28 = dVar7;
      if ((valuesFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      __x = (*valuesFunc->_M_invoker)((_Any_data *)valuesFunc,pRVar5);
      std::vector<double,_std::allocator<double>_>::vector(&local_58,__x);
      uVar4 = (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar3 = uVar4 >> 1;
      if ((local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start) &&
         (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start + uVar3 !=
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        lVar2 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  ();
        uVar3 = (ulong)((long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) >> 1;
      }
      dVar6 = ((double)uVar3 * local_40) / 100.0;
      uVar4 = (ulong)dVar6;
      uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      dVar6 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3 - uVar4];
      dVar7 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3 + uVar4];
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        local_38 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3 - uVar4];
        local_30 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3 + uVar4];
        operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        dVar6 = local_38;
        dVar7 = local_30;
      }
      if (local_60 <= dVar6) {
        dVar6 = local_60;
      }
      if (dVar7 <= local_28) {
        dVar7 = local_28;
      }
      pRVar5 = pRVar5 + 1;
      local_60 = dVar6;
    } while (pRVar5 != pRVar1);
  }
  sVar8.second = dVar7;
  sVar8.first = dVar6;
  return sVar8;
}

Assistant:

typename ResultT::storage_range_t calculateMedianRange(const std::vector<ResultT>& rs, std::function<const std::vector<typename ResultT::storage_t>&(const ResultT&)> valuesFunc, typename ResultT::storage_t sizePercent)
{
    // calculate min / max percentage range of all values around median
    typename ResultT::storage_range_t rangeMinMax(std::numeric_limits<typename ResultT::storage_t>::max(), std::numeric_limits<typename ResultT::storage_t>::lowest());
    for (const auto& r : rs)
    {
        // calculate median of values
        std::vector<typename ResultT::storage_t> v = valuesFunc(r);
        std::nth_element(v.begin(), v.begin() + v.size() / 2, v.end());
        auto medianIt = v.cbegin() + v.size() / 2;
        // now get sizePercent values centered around median
        const decltype(v.size()) halfRange = v.size() / 2 * sizePercent / 100;
        auto leftIt = std::prev(medianIt, halfRange);
        auto rightIt = std::next(medianIt, halfRange);
        rangeMinMax.first = std::min(rangeMinMax.first, *leftIt);
        rangeMinMax.second = std::max(rangeMinMax.second, *rightIt);
    }
    return rangeMinMax;
}